

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O2

QUrl __thiscall
QFileDialog::getSaveFileUrl
          (QFileDialog *this,QWidget *parent,QString *caption,QUrl *dir,QString *filter,
          QString *selectedFilter,Options options,QStringList *supportedSchemes)

{
  long lVar1;
  qsizetype qVar2;
  Data *pDVar3;
  QUrl *pQVar4;
  bool bVar5;
  int iVar6;
  QFileDialog *this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<QUrl> local_c8;
  QAutoPointer<QFileDialog> local_a8;
  QFileDialogArgs args;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  args.filter.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  args._88_8_ = &DAT_aaaaaaaaaaaaaaaa;
  args.filter.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  args.filter.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  args.selection.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  args.selection.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  args.directory.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  args.selection.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  args.caption.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  args.caption.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  args.parent = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
  args.caption.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QFileDialogArgs::QFileDialogArgs(&args,dir);
  args.parent = parent;
  QString::operator=(&args.caption,(QString *)caption);
  QString::operator=(&args.filter,(QString *)filter);
  args._88_8_ = (ulong)(uint)options.super_QFlagsStorageHelper<QFileDialog::Option,_4>.
                             super_QFlagsStorage<QFileDialog::Option>.i << 0x20;
  local_a8.o.wp.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.o.wp.value = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = (QFileDialog *)operator_new(0x28);
  QFileDialog(this_00,&args);
  QPointer<QFileDialog>::QPointer<void>(&local_a8.o,this_00);
  setSupportedSchemes((QFileDialog *)local_a8.o.wp.value,supportedSchemes);
  setAcceptMode((QFileDialog *)local_a8.o.wp.value,AcceptSave);
  if ((selectedFilter != (QString *)0x0) && ((selectedFilter->d).size != 0)) {
    selectNameFilter((QFileDialog *)local_a8.o.wp.value,selectedFilter);
  }
  iVar6 = (**(code **)(*(long *)local_a8.o.wp.value + 0x1a8))();
  bVar5 = QAutoPointer::operator_cast_to_bool((QAutoPointer *)&local_a8);
  if ((bVar5) && (iVar6 == 1)) {
    if (selectedFilter != (QString *)0x0) {
      selectedNameFilter((QString *)&local_c8,(QFileDialog *)local_a8.o.wp.value);
      pDVar3 = (selectedFilter->d).d;
      pQVar4 = (QUrl *)(selectedFilter->d).ptr;
      (selectedFilter->d).d = (Data *)local_c8.d;
      (selectedFilter->d).ptr = (char16_t *)local_c8.ptr;
      qVar2 = (selectedFilter->d).size;
      (selectedFilter->d).size = local_c8.size;
      local_c8.d = (Data *)pDVar3;
      local_c8.ptr = pQVar4;
      local_c8.size = qVar2;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_c8);
    }
    selectedUrls((QList<QUrl> *)&local_c8,(QFileDialog *)local_a8.o.wp.value);
    QList<QUrl>::value((QList<QUrl> *)this,(qsizetype)&local_c8);
    QArrayDataPointer<QUrl>::~QArrayDataPointer(&local_c8);
  }
  else {
    QUrl::QUrl((QUrl *)this);
  }
  QAutoPointer<QFileDialog>::~QAutoPointer(&local_a8);
  QFileDialogArgs::~QFileDialogArgs(&args);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QUrl)(QUrlPrivate *)this;
  }
  __stack_chk_fail();
}

Assistant:

QUrl QFileDialog::getSaveFileUrl(QWidget *parent,
                                 const QString &caption,
                                 const QUrl &dir,
                                 const QString &filter,
                                 QString *selectedFilter,
                                 Options options,
                                 const QStringList &supportedSchemes)
{
    QFileDialogArgs args(dir);
    args.parent = parent;
    args.caption = caption;
    args.filter = filter;
    args.mode = AnyFile;
    args.options = options;

    QAutoPointer<QFileDialog> dialog(new QFileDialog(args));
    dialog->setSupportedSchemes(supportedSchemes);
    dialog->setAcceptMode(AcceptSave);
    if (selectedFilter && !selectedFilter->isEmpty())
        dialog->selectNameFilter(*selectedFilter);
    const int execResult = dialog->exec();
    if (bool(dialog) && execResult == QDialog::Accepted) {
        if (selectedFilter)
            *selectedFilter = dialog->selectedNameFilter();
        return dialog->selectedUrls().value(0);
    }
    return QUrl();
}